

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::anon_unknown_0::ReconstructMaterialBindingProperties
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *properties,MaterialBinding *mb,string *err)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  Relationship *pRVar9;
  Relationship *args;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  Relationship *rel_5;
  token mat_purpose_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2360;
  allocator local_2339;
  string local_2338 [32];
  fmt local_2318 [32];
  ostringstream local_22f8 [8];
  ostringstream ss_e_15;
  allocator local_2179;
  string local_2178;
  undefined1 local_2158 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2120;
  ostringstream local_2100 [8];
  ostringstream ss_e_14;
  allocator local_1f81;
  string local_1f80 [32];
  string local_1f60 [32];
  undefined1 local_1f40 [8];
  string purpose_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f00;
  allocator local_1ed9;
  string local_1ed8 [32];
  fmt local_1eb8 [32];
  ostringstream local_1e98 [8];
  ostringstream ss_e_13;
  allocator local_1d19;
  string local_1d18 [32];
  string local_1cf8 [32];
  _Base_ptr local_1cd8;
  undefined1 local_1cd0;
  Token local_1cc8;
  Relationship *local_1ca8;
  Relationship *rel_4;
  undefined1 local_1c80 [8];
  token mat_purpose;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c40;
  ostringstream local_1c20 [8];
  ostringstream ss_e_12;
  allocator local_1aa1;
  string local_1aa0;
  undefined1 local_1a80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a40;
  ostringstream local_1a20 [8];
  ostringstream ss_e_11;
  allocator local_18a1;
  string local_18a0 [32];
  string local_1880 [32];
  undefined1 local_1860 [8];
  string collection_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1820;
  allocator local_17f9;
  string local_17f8 [32];
  fmt local_17d8 [32];
  ostringstream local_17b8 [8];
  ostringstream ss_e_10;
  allocator local_1639;
  string local_1638 [32];
  string local_1618 [32];
  _Base_ptr local_15f8;
  undefined1 local_15f0;
  Token local_15e8;
  Token local_15c8;
  Relationship *local_15a8;
  Relationship *rel_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1580;
  allocator local_1559;
  string local_1558 [32];
  fmt local_1538 [32];
  ostringstream local_1518 [8];
  ostringstream ss_e_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1380;
  allocator local_1359;
  string local_1358 [32];
  string local_1338;
  ostringstream local_1318 [8];
  ostringstream ss_e_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1160;
  allocator local_1139;
  string local_1138 [32];
  string local_1118;
  ostringstream local_10f8 [8];
  ostringstream ss_e_7;
  Relationship *rel_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38;
  allocator local_f11;
  string local_f10 [32];
  string local_ef0;
  ostringstream local_ed0 [8];
  ostringstream ss_e_6;
  allocator local_d51;
  undefined1 local_d50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  allocator local_ce9;
  string local_ce8 [32];
  string local_cc8;
  ostringstream local_ca8 [8];
  ostringstream ss_e_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  allocator local_ac9;
  string local_ac8 [32];
  string local_aa8;
  ostringstream local_a88 [8];
  ostringstream ss_e_4;
  Relationship *rel_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  allocator local_8a1;
  string local_8a0 [32];
  string local_880;
  ostringstream local_860 [8];
  ostringstream ss_e_3;
  allocator local_6e1;
  undefined1 local_6e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  allocator local_679;
  string local_678 [32];
  string local_658;
  ostringstream local_638 [8];
  ostringstream ss_e_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  allocator local_459;
  string local_458 [32];
  string local_438;
  ostringstream local_418 [8];
  ostringstream ss_e_1;
  Relationship *rel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  allocator local_231;
  string local_230 [32];
  string local_210;
  ostringstream local_1f0 [8];
  ostringstream ss_e;
  allocator local_71;
  undefined1 local_70 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *__range2;
  string *err_local;
  MaterialBinding *mb_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *properties_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *table_local;
  
  if (mb == (MaterialBinding *)0x0) {
    table_local._7_1_ = 0;
    goto LAB_002be227;
  }
  args = (Relationship *)err;
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   *)properties);
LAB_002bbfcd:
  bVar2 = ::std::operator!=(&__end2,(_Self *)&prop);
  if (!bVar2) goto LAB_002be223;
  local_70._32_8_ =
       ::std::
       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
       ::operator*(&__end2);
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70._32_8_,"material:binding");
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_70,"material:binding",&local_71);
    sVar4 = ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(table,(key_type *)local_70);
    ::std::__cxx11::string::~string((string *)local_70);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (sVar4 != 0) goto LAB_002be215;
    bVar2 = Property::is_relationship((Property *)(local_70._32_8_ + 0x20));
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_1f0);
      poVar5 = ::std::operator<<((ostream *)local_1f0,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x9f0);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_230,"Property `{}` must be a Relationship.",&local_231);
      fmt::format<char_const*>
                (&local_210,(fmt *)local_230,(string *)&kMaterialBinding,(char **)args);
      poVar5 = ::std::operator<<((ostream *)local_1f0,(string *)&local_210);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::__cxx11::string::~string(local_230);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_258,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rel,
                         err);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_258);
        ::std::__cxx11::string::~string((string *)&local_258);
        ::std::__cxx11::string::~string((string *)&rel);
      }
      table_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1f0);
      goto LAB_002be227;
    }
    pRVar9 = Property::get_relationship((Property *)(local_70._32_8_ + 0x20));
    bVar2 = Relationship::is_path(pRVar9);
    if (bVar2) {
      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                (&mb->materialBinding,pRVar9);
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(table,(value_type_conflict *)local_70._32_8_);
      goto LAB_002be215;
    }
    bVar2 = Relationship::is_pathvector(pRVar9);
    if (bVar2) {
      sVar7 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        (&pRVar9->targetPathVector);
      if (sVar7 != 1) {
        ::std::__cxx11::ostringstream::ostringstream(local_418);
        poVar5 = ::std::operator<<((ostream *)local_418,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x9f0);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_458,"`{}` target is empty or has mutiple Paths. Must be single Path.",
                   &local_459);
        fmt::format<char_const*>
                  (&local_438,(fmt *)local_458,(string *)&kMaterialBinding,(char **)args);
        poVar5 = ::std::operator<<((ostream *)local_418,(string *)&local_438);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_438);
        ::std::__cxx11::string::~string(local_458);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_459);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(&local_480,&local_4a0,err);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_480);
          ::std::__cxx11::string::~string((string *)&local_480);
          ::std::__cxx11::string::~string((string *)&local_4a0);
        }
        table_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_418);
        goto LAB_002be227;
      }
      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                (&mb->materialBinding,pRVar9);
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(table,(value_type_conflict *)local_70._32_8_);
      goto LAB_002be215;
    }
    bVar2 = Relationship::has_value(pRVar9);
    if (bVar2) {
      bVar2 = Relationship::is_blocked(pRVar9);
      if (bVar2) {
        nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                  (&mb->materialBinding,pRVar9);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(table,(value_type_conflict *)local_70._32_8_);
        goto LAB_002bc602;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_638);
      poVar5 = ::std::operator<<((ostream *)local_638,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x9f0);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_678,"Internal error. Property `{}` is not a valid Relationship.",&local_679);
      fmt::format<char_const*>
                (&local_658,(fmt *)local_678,(string *)&kMaterialBinding,(char **)args);
      poVar5 = ::std::operator<<((ostream *)local_638,(string *)&local_658);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_658);
      ::std::__cxx11::string::~string(local_678);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_679);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_6a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_6e0 + 0x20),err);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_6a0);
        ::std::__cxx11::string::~string((string *)&local_6a0);
        ::std::__cxx11::string::~string((string *)(local_6e0 + 0x20));
      }
      table_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_638);
      goto LAB_002be227;
    }
    nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=(&mb->materialBinding,pRVar9);
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(table,(value_type_conflict *)local_70._32_8_);
  }
LAB_002bc602:
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70._32_8_,"material:binding:preview");
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_6e0,"material:binding:preview",&local_6e1);
    sVar4 = ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(table,(key_type *)local_6e0);
    ::std::__cxx11::string::~string((string *)local_6e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
    if (sVar4 != 0) goto LAB_002be215;
    bVar2 = Property::is_relationship((Property *)(local_70._32_8_ + 0x20));
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_860);
      poVar5 = ::std::operator<<((ostream *)local_860,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x9f1);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8a0,"Property `{}` must be a Relationship.",&local_8a1);
      fmt::format<char_const*>
                (&local_880,(fmt *)local_8a0,(string *)&kMaterialBindingPreview,(char **)args);
      poVar5 = ::std::operator<<((ostream *)local_860,(string *)&local_880);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_880);
      ::std::__cxx11::string::~string(local_8a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_8c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rel_1
                         ,err);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_8c8);
        ::std::__cxx11::string::~string((string *)&local_8c8);
        ::std::__cxx11::string::~string((string *)&rel_1);
      }
      table_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_860);
      goto LAB_002be227;
    }
    pRVar9 = Property::get_relationship((Property *)(local_70._32_8_ + 0x20));
    bVar2 = Relationship::is_path(pRVar9);
    if (bVar2) {
      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                (&mb->materialBindingPreview,pRVar9);
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(table,(value_type_conflict *)local_70._32_8_);
      goto LAB_002be215;
    }
    bVar2 = Relationship::is_pathvector(pRVar9);
    if (bVar2) {
      sVar7 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        (&pRVar9->targetPathVector);
      if (sVar7 != 1) {
        ::std::__cxx11::ostringstream::ostringstream(local_a88);
        poVar5 = ::std::operator<<((ostream *)local_a88,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x9f1);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_ac8,"`{}` target is empty or has mutiple Paths. Must be single Path.",
                   &local_ac9);
        fmt::format<char_const*>
                  (&local_aa8,(fmt *)local_ac8,(string *)&kMaterialBindingPreview,(char **)args);
        poVar5 = ::std::operator<<((ostream *)local_a88,(string *)&local_aa8);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_aa8);
        ::std::__cxx11::string::~string(local_ac8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(&local_af0,&local_b10,err);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_af0);
          ::std::__cxx11::string::~string((string *)&local_af0);
          ::std::__cxx11::string::~string((string *)&local_b10);
        }
        table_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_a88);
        goto LAB_002be227;
      }
      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                (&mb->materialBindingPreview,pRVar9);
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(table,(value_type_conflict *)local_70._32_8_);
      goto LAB_002be215;
    }
    bVar2 = Relationship::has_value(pRVar9);
    if (bVar2) {
      bVar2 = Relationship::is_blocked(pRVar9);
      if (bVar2) {
        nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                  (&mb->materialBindingPreview,pRVar9);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(table,(value_type_conflict *)local_70._32_8_);
        goto LAB_002bcc42;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_ca8);
      poVar5 = ::std::operator<<((ostream *)local_ca8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x9f1);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_ce8,"Internal error. Property `{}` is not a valid Relationship.",&local_ce9);
      fmt::format<char_const*>
                (&local_cc8,(fmt *)local_ce8,(string *)&kMaterialBindingPreview,(char **)args);
      poVar5 = ::std::operator<<((ostream *)local_ca8,(string *)&local_cc8);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_cc8);
      ::std::__cxx11::string::~string(local_ce8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_d10,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_d50 + 0x20),err);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_d10);
        ::std::__cxx11::string::~string((string *)&local_d10);
        ::std::__cxx11::string::~string((string *)(local_d50 + 0x20));
      }
      table_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_ca8);
      goto LAB_002be227;
    }
    nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
              (&mb->materialBindingPreview,pRVar9);
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(table,(value_type_conflict *)local_70._32_8_);
  }
LAB_002bcc42:
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70._32_8_,"material:binding:preview");
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_d50,"material:binding:preview",&local_d51);
    sVar4 = ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(table,(key_type *)local_d50);
    ::std::__cxx11::string::~string((string *)local_d50);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_d51);
    if (sVar4 != 0) goto LAB_002be215;
    bVar2 = Property::is_relationship((Property *)(local_70._32_8_ + 0x20));
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_ed0);
      poVar5 = ::std::operator<<((ostream *)local_ed0,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x9f2);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f10,"Property `{}` must be a Relationship.",&local_f11);
      fmt::format<char_const*>
                (&local_ef0,(fmt *)local_f10,(string *)&kMaterialBindingPreview,(char **)args);
      poVar5 = ::std::operator<<((ostream *)local_ed0,(string *)&local_ef0);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_ef0);
      ::std::__cxx11::string::~string(local_f10);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f11);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_f38,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rel_2
                         ,err);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_f38);
        ::std::__cxx11::string::~string((string *)&local_f38);
        ::std::__cxx11::string::~string((string *)&rel_2);
      }
      table_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_ed0);
      goto LAB_002be227;
    }
    pRVar9 = Property::get_relationship((Property *)(local_70._32_8_ + 0x20));
    bVar2 = Relationship::is_path(pRVar9);
    if (bVar2) {
      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                (&mb->materialBindingFull,pRVar9);
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(table,(value_type_conflict *)local_70._32_8_);
      goto LAB_002be215;
    }
    bVar2 = Relationship::is_pathvector(pRVar9);
    if (bVar2) {
      sVar7 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                        (&pRVar9->targetPathVector);
      if (sVar7 != 1) {
        ::std::__cxx11::ostringstream::ostringstream(local_10f8);
        poVar5 = ::std::operator<<((ostream *)local_10f8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x9f2);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1138,"`{}` target is empty or has mutiple Paths. Must be single Path.",
                   &local_1139);
        fmt::format<char_const*>
                  (&local_1118,(fmt *)local_1138,(string *)&kMaterialBindingPreview,(char **)args);
        poVar5 = ::std::operator<<((ostream *)local_10f8,(string *)&local_1118);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_1118);
        ::std::__cxx11::string::~string(local_1138);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1139);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(&local_1160,&local_1180,err);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_1160);
          ::std::__cxx11::string::~string((string *)&local_1160);
          ::std::__cxx11::string::~string((string *)&local_1180);
        }
        table_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_10f8);
        goto LAB_002be227;
      }
      nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                (&mb->materialBindingFull,pRVar9);
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(table,(value_type_conflict *)local_70._32_8_);
      goto LAB_002be215;
    }
    bVar2 = Relationship::has_value(pRVar9);
    if (bVar2) {
      bVar2 = Relationship::is_blocked(pRVar9);
      if (bVar2) {
        nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                  (&mb->materialBindingFull,pRVar9);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(table,(value_type_conflict *)local_70._32_8_);
        goto LAB_002bd282;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1318);
      poVar5 = ::std::operator<<((ostream *)local_1318,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x9f2);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1358,"Internal error. Property `{}` is not a valid Relationship.",&local_1359
                );
      fmt::format<char_const*>
                (&local_1338,(fmt *)local_1358,(string *)&kMaterialBindingPreview,(char **)args);
      poVar5 = ::std::operator<<((ostream *)local_1318,(string *)&local_1338);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_1338);
      ::std::__cxx11::string::~string(local_1358);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1359);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_1380,&local_13a0,err);
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_1380);
        ::std::__cxx11::string::~string((string *)&local_1380);
        ::std::__cxx11::string::~string((string *)&local_13a0);
      }
      table_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1318);
      goto LAB_002be227;
    }
    nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
              (&mb->materialBindingFull,pRVar9);
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(table,(value_type_conflict *)local_70._32_8_);
  }
LAB_002bd282:
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70._32_8_,"material:binding:collection");
  uVar1 = local_70._32_8_;
  if (bVar2) {
    sVar4 = ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(table,(key_type *)local_70._32_8_);
    if (sVar4 == 0) {
      bVar2 = Property::is_relationship((Property *)(local_70._32_8_ + 0x20));
      if (!bVar2) {
        ::std::__cxx11::ostringstream::ostringstream(local_1518);
        poVar5 = ::std::operator<<((ostream *)local_1518,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x9fb);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_1558,"`{}` must be a Relationship",&local_1559);
        fmt::format<std::__cxx11::string>
                  (local_1538,(string *)local_1558,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_70._32_8_);
        poVar5 = ::std::operator<<((ostream *)local_1518,(string *)local_1538);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)local_1538);
        ::std::__cxx11::string::~string(local_1558);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1559);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(&local_1580,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rel_3,err);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_1580);
          ::std::__cxx11::string::~string((string *)&local_1580);
          ::std::__cxx11::string::~string((string *)&rel_3);
        }
        table_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_1518);
        goto LAB_002be227;
      }
      local_15a8 = Property::get_relationship((Property *)(local_70._32_8_ + 0x20));
      Token::Token(&local_15c8,"");
      Token::Token(&local_15e8,"");
      args = local_15a8;
      MaterialBinding::set_materialBindingCollection(mb,&local_15c8,&local_15e8,local_15a8);
      Token::~Token(&local_15e8);
      Token::~Token(&local_15c8);
      pVar10 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(table,(value_type_conflict *)local_70._32_8_);
      local_15f8 = (_Base_ptr)pVar10.first._M_node;
      local_15f0 = pVar10.second;
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1638,":",&local_1639);
    ::std::operator+((char *)local_1618,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "material:binding:collection");
    bVar2 = startsWith((string *)uVar1,local_1618);
    ::std::__cxx11::string::~string((string *)local_1618);
    ::std::__cxx11::string::~string(local_1638);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1639);
    uVar1 = local_70._32_8_;
    if (bVar2) {
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(table,(key_type *)local_70._32_8_);
      if (sVar4 == 0) {
        bVar2 = Property::is_relationship((Property *)(local_70._32_8_ + 0x20));
        uVar1 = local_70._32_8_;
        if (bVar2) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_18a0,":",&local_18a1);
          ::std::operator+((char *)local_1880,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "material:binding:collection");
          removePrefix((tinyusdz *)local_1860,(string *)uVar1,local_1880);
          ::std::__cxx11::string::~string((string *)local_1880);
          ::std::__cxx11::string::~string(local_18a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_18a1);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_1aa0,":",&local_1aa1);
            iVar3 = ::std::numeric_limits<int>::max();
            args = (Relationship *)((long)iVar3 / 100 & 0xffffffff);
            split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a80,(string *)local_1860,&local_1aa0,(uint32_t)((long)iVar3 / 100));
            ::std::__cxx11::string::~string((string *)&local_1aa0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1aa1);
            sVar7 = ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1a80);
            if (sVar7 < 3) {
              Token::Token((Token *)local_1c80);
              sVar7 = ::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_1a80);
              if (sVar7 == 1) {
                pvVar8 = ::std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_1a80,0);
                ::std::__cxx11::string::operator=((string *)local_1860,(string *)pvVar8);
              }
              else {
                pvVar8 = ::std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_1a80,0);
                Token::Token((Token *)&rel_4,pvVar8);
                Token::operator=((Token *)local_1c80,(Token *)&rel_4);
                Token::~Token((Token *)&rel_4);
                pvVar8 = ::std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_1a80,1);
                ::std::__cxx11::string::operator=((string *)local_1860,(string *)pvVar8);
              }
              local_1ca8 = Property::get_relationship((Property *)(local_70._32_8_ + 0x20));
              Token::Token(&local_1cc8,(string *)local_1860);
              args = local_1ca8;
              MaterialBinding::set_materialBindingCollection
                        (mb,&local_1cc8,(token *)local_1c80,local_1ca8);
              Token::~Token(&local_1cc8);
              pVar10 = ::std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::insert(table,(value_type_conflict *)local_70._32_8_);
              local_1cd8 = (_Base_ptr)pVar10.first._M_node;
              local_1cd0 = pVar10.second;
              names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
              Token::~Token((Token *)local_1c80);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_1c20);
              poVar5 = ::std::operator<<((ostream *)local_1c20,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xa16);
              ::std::operator<<(poVar5," ");
              poVar5 = ::std::operator<<((ostream *)local_1c20,
                                         "3 or more namespaces is not allowed for \'mateirial:binding:collection\'"
                                        );
              ::std::operator<<(poVar5,"\n");
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(&local_1c40,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&mat_purpose.str_.field_2 + 8),err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_1c40);
                ::std::__cxx11::string::~string((string *)&local_1c40);
                ::std::__cxx11::string::~string
                          ((string *)(mat_purpose.str_.field_2._M_local_buf + 8));
              }
              table_local._7_1_ = 0;
              names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_1c20);
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1a80);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1a20);
            poVar5 = ::std::operator<<((ostream *)local_1a20,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xa12);
            ::std::operator<<(poVar5," ");
            poVar5 = ::std::operator<<((ostream *)local_1a20,
                                       "empty NAME is not allowed for \'mateirial:binding:collection\'"
                                      );
            ::std::operator<<(poVar5,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_1a40,&local_1a60,err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_1a40);
              ::std::__cxx11::string::~string((string *)&local_1a40);
              ::std::__cxx11::string::~string((string *)&local_1a60);
            }
            table_local._7_1_ = 0;
            names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1a20);
          }
          ::std::__cxx11::string::~string((string *)local_1860);
          goto joined_r0x002bdb8b;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_17b8);
        poVar5 = ::std::operator<<((ostream *)local_17b8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xa0d);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_17f8,"`{}` must be a Relationship",&local_17f9);
        fmt::format<std::__cxx11::string>
                  (local_17d8,(string *)local_17f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_70._32_8_);
        poVar5 = ::std::operator<<((ostream *)local_17b8,(string *)local_17d8);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)local_17d8);
        ::std::__cxx11::string::~string(local_17f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_17f9);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(&local_1820,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&collection_name.field_2 + 8),err);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_1820);
          ::std::__cxx11::string::~string((string *)&local_1820);
          ::std::__cxx11::string::~string((string *)(collection_name.field_2._M_local_buf + 8));
        }
        table_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_17b8);
        goto LAB_002be227;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d18,":",&local_1d19);
      ::std::operator+((char *)local_1cf8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "material:binding");
      bVar2 = startsWith((string *)uVar1,local_1cf8);
      ::std::__cxx11::string::~string((string *)local_1cf8);
      ::std::__cxx11::string::~string(local_1d18);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d19);
      if ((bVar2) &&
         (sVar4 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(table,(key_type *)local_70._32_8_), sVar4 == 0)) {
        bVar2 = Property::is_relationship((Property *)(local_70._32_8_ + 0x20));
        uVar1 = local_70._32_8_;
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream(local_1e98);
          poVar5 = ::std::operator<<((ostream *)local_1e98,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xa2f);
          ::std::operator<<(poVar5," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1ed8,"`{}` must be a Relationship",&local_1ed9);
          fmt::format<std::__cxx11::string>
                    (local_1eb8,(string *)local_1ed8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_70._32_8_);
          poVar5 = ::std::operator<<((ostream *)local_1e98,(string *)local_1eb8);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::string::~string((string *)local_1eb8);
          ::std::__cxx11::string::~string(local_1ed8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1ed9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(&local_1f00,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&purpose_name.field_2 + 8),err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&local_1f00);
            ::std::__cxx11::string::~string((string *)&local_1f00);
            ::std::__cxx11::string::~string((string *)(purpose_name.field_2._M_local_buf + 8));
          }
          table_local._7_1_ = 0;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1e98);
          goto LAB_002be227;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_1f80,":",&local_1f81);
        ::std::operator+((char *)local_1f60,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "material:binding");
        removePrefix((tinyusdz *)local_1f40,(string *)uVar1,local_1f60);
        ::std::__cxx11::string::~string((string *)local_1f60);
        ::std::__cxx11::string::~string(local_1f80);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1f81);
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_2178,":",&local_2179);
          iVar3 = ::std::numeric_limits<int>::max();
          args = (Relationship *)((long)iVar3 / 100 & 0xffffffff);
          split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2158,(string *)local_1f40,&local_2178,(uint32_t)((long)iVar3 / 100));
          ::std::__cxx11::string::~string((string *)&local_2178);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2179);
          sVar7 = ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2158);
          if (sVar7 < 2) {
            pvVar8 = ::std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_2158,0);
            Token::Token((Token *)&rel_5,pvVar8);
            pRVar9 = Property::get_relationship((Property *)(local_70._32_8_ + 0x20));
            MaterialBinding::set_materialBinding(mb,pRVar9,(token *)&rel_5);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(table,(value_type_conflict *)local_70._32_8_);
            names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
            Token::~Token((Token *)&rel_5);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_22f8);
            poVar5 = ::std::operator<<((ostream *)local_22f8,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xa38);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_2338,
                       "PURPOSE `{}` must not have nested namespaces for \'mateirial:binding\'",
                       &local_2339);
            fmt::format<std::__cxx11::string>
                      (local_2318,(string *)local_2338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f40);
            poVar5 = ::std::operator<<((ostream *)local_22f8,(string *)local_2318);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)local_2318);
            ::std::__cxx11::string::~string(local_2338);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2339);
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_2360,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&mat_purpose_1.str_.field_2 + 8),err);
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_2360);
              ::std::__cxx11::string::~string((string *)&local_2360);
              ::std::__cxx11::string::~string
                        ((string *)(mat_purpose_1.str_.field_2._M_local_buf + 8));
            }
            table_local._7_1_ = 0;
            names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_22f8);
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2158);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_2100);
          poVar5 = ::std::operator<<((ostream *)local_2100,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructMaterialBindingProperties");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xa34);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_2100,
                                     "empty PURPOSE is not allowed for \'mateirial:binding:\'");
          ::std::operator<<(poVar5,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(&local_2120,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &names_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&local_2120);
            ::std::__cxx11::string::~string((string *)&local_2120);
            ::std::__cxx11::string::~string
                      ((string *)
                       &names_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          table_local._7_1_ = 0;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_2100);
        }
        ::std::__cxx11::string::~string((string *)local_1f40);
joined_r0x002bdb8b:
        if (names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 1) goto LAB_002be227;
      }
    }
  }
LAB_002be215:
  ::std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
  ::operator++(&__end2);
  goto LAB_002bbfcd;
LAB_002be223:
  table_local._7_1_ = 1;
LAB_002be227:
  return (bool)(table_local._7_1_ & 1);
}

Assistant:

bool ReconstructMaterialBindingProperties(
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  MaterialBinding *mb, /* inout */
  std::string *err)
{

  if (!mb) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBinding, mb->materialBinding)
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBindingPreview, mb->materialBindingPreview)
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBindingPreview, mb->materialBindingFull)
    // material:binding:collection
    if (prop.first == kMaterialBindingCollection) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBindingCollection(value::token(""), value::token(""), rel);

      table.insert(prop.first);
      continue;
    }
    // material:binding:collection[:PURPOSE]:NAME
    if (startsWith(prop.first, kMaterialBindingCollection + std::string(":"))) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      std::string collection_name = removePrefix(prop.first, kMaterialBindingCollection + std::string(":"));
      if (collection_name.empty()) {
        PUSH_ERROR_AND_RETURN("empty NAME is not allowed for 'mateirial:binding:collection'");
      }
      std::vector<std::string> names = split(collection_name, ":");
      if (names.size() > 2) {
        PUSH_ERROR_AND_RETURN("3 or more namespaces is not allowed for 'mateirial:binding:collection'");
      }
      value::token mat_purpose; // empty = all-purpose
      if (names.size() == 1) {
        collection_name = names[0];
      } else {
        mat_purpose = value::token(names[0]);
        collection_name = names[1];
      }

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBindingCollection(value::token(collection_name), mat_purpose, rel);

      table.insert(prop.first);
      continue;
    }
    // material:binding:PURPOSE
    if (startsWith(prop.first, kMaterialBinding + std::string(":"))) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      std::string purpose_name = removePrefix(prop.first, kMaterialBinding + std::string(":"));
      if (purpose_name.empty()) {
        PUSH_ERROR_AND_RETURN("empty PURPOSE is not allowed for 'mateirial:binding:'");
      }
      std::vector<std::string> names = split(purpose_name, ":");
      if (names.size() > 1) {
        PUSH_ERROR_AND_RETURN(fmt::format("PURPOSE `{}` must not have nested namespaces for 'mateirial:binding'", purpose_name));
      }
      value::token mat_purpose = value::token(names[0]);

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBinding(rel, mat_purpose);

      table.insert(prop.first);
      continue;
    }
  }

  return true;
}